

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::Mutex::UnlockSlow(Mutex *this,SynchWaitParams *waitp)

{
  ulong uVar1;
  SynchWaitParams *pSVar2;
  Condition *pCVar3;
  PerThreadSynch *pPVar4;
  PerThreadSynch *pPVar5;
  PerThreadSynch *pPVar6;
  PerThreadSynch *pPVar7;
  char cVar8;
  bool bVar9;
  uint uVar10;
  PerThreadSynch *pPVar11;
  PerThreadSynch *pPVar12;
  PerThreadSynch *pPVar13;
  long lVar14;
  ulong uVar15;
  int mode;
  int extraout_EDX;
  PerThreadSynch *extraout_RDX;
  PerThreadSynch *extraout_RDX_00;
  PerThreadSynch *extraout_RDX_01;
  PerThreadSynch *extraout_RDX_02;
  PerThreadSynch *extraout_RDX_03;
  PerThreadSynch *pPVar16;
  PerThreadSynch *extraout_RDX_04;
  PerThreadSynch *extraout_RDX_05;
  PerThreadSynch *extraout_RDX_06;
  PerThreadSynch *extraout_RDX_07;
  PerThreadSynch *extraout_RDX_08;
  PerThreadSynch *extraout_RDX_09;
  PerThreadSynch *extraout_RDX_10;
  PerThreadSynch *extraout_RDX_11;
  byte bVar17;
  PerThreadSynch *pPVar18;
  synchronization_internal *this_00;
  long lVar19;
  bool bVar20;
  PerThreadSynch *local_80;
  PerThreadSynch *wake_list;
  PerThreadSynch *local_60;
  PerThreadSynch *local_58;
  PerThreadSynch *local_50;
  SynchWaitParams *local_48;
  PerThreadSynch *local_40;
  PerThreadSynch *local_38;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  AssertReaderHeld(this);
  CheckForMutexCorruption(uVar1,"Unlock");
  pPVar13 = extraout_RDX;
  if ((uVar1 & 0x10) != 0) {
    PostSynchEvent(this,((uVar1 & 8) == 0) + 8);
    pPVar13 = extraout_RDX_00;
  }
  wake_list = (PerThreadSynch *)0x1;
  if (((waitp != (SynchWaitParams *)0x0) && (waitp->thread->waitp != (SynchWaitParams *)0x0)) &&
     (waitp->thread->suppress_fatal_errors == false)) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x81b,"Check %s failed: %s",
               "waitp == nullptr || waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors"
               ,"detected illegal recursion into Mutex code");
    pPVar13 = extraout_RDX_11;
  }
  local_60 = (PerThreadSynch *)0x0;
  local_48 = (SynchWaitParams *)0x0;
  local_80 = (PerThreadSynch *)0x0;
  local_58 = (PerThreadSynch *)0x0;
  pPVar16 = (PerThreadSynch *)0x0;
  this_00 = (synchronization_internal *)0x0;
LAB_001082ee:
  while( true ) {
    mode = (int)pPVar13;
    uVar1 = (this->mu_).super___atomic_base<long>._M_i;
    if (((uVar1 & 8) == 0) || (((uint)uVar1 & 6) == 4 || waitp != (SynchWaitParams *)0x0)) break;
    uVar15 = uVar1 & 0xffffffffffffffd7;
LAB_0010833e:
    LOCK();
    bVar20 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar20) {
      (this->mu_).super___atomic_base<long>._M_i = uVar15;
    }
    UNLOCK();
    if (bVar20) {
      return;
    }
LAB_00108364:
    uVar10 = synchronization_internal::MutexDelay(this_00,0,mode);
    this_00 = (synchronization_internal *)(ulong)uVar10;
    pPVar13 = extraout_RDX_01;
  }
  if (((uint)uVar1 & 5) == 1 && waitp == (SynchWaitParams *)0x0) {
    bVar20 = ExactlyOneReader(uVar1);
    uVar15 = (uVar1 - bVar20) - 0x100;
    mode = extraout_EDX;
    goto LAB_0010833e;
  }
  if ((uVar1 & 0x40) != 0) goto LAB_00108364;
  LOCK();
  uVar15 = (this->mu_).super___atomic_base<long>._M_i;
  bVar20 = uVar1 == uVar15;
  if (bVar20) {
    (this->mu_).super___atomic_base<long>._M_i = uVar1 | 0x40;
    uVar15 = uVar1;
  }
  UNLOCK();
  if (!bVar20) goto LAB_00108364;
  if ((uVar15 & 4) != 0) {
    pPVar18 = (PerThreadSynch *)(uVar15 & 0xffffffffffffff00);
    if (((uVar15 & 1) != 0) && (0x100 < (long)(pPVar18->readers & 0xffffffffffffff00U))) {
      pPVar18->readers = pPVar18->readers - 0x100;
      if (waitp != (SynchWaitParams *)0x0) {
        pPVar18 = Enqueue(pPVar18,waitp,uVar15,2);
        pPVar13 = extraout_RDX_02;
        if (pPVar18 == (PerThreadSynch *)0x0) {
          raw_logging_internal::RawLog
                    (kFatal,"mutex.cc",0x866,"Check %s failed: %s","new_h != nullptr",
                     "waiters disappeared during Enqueue()!");
          pPVar13 = extraout_RDX_10;
        }
        uVar15 = uVar15 & 0xff | (ulong)pPVar18;
      }
      goto LAB_0010876a;
    }
    if (local_80 != (PerThreadSynch *)0x0) {
      if (pPVar18->maybe_unlocking == false) {
        raw_logging_internal::RawLog
                  (kFatal,"mutex.cc",0x872,"Check %s failed: %s",
                   "old_h == nullptr || h->maybe_unlocking","Mutex queue changed beneath us");
      }
      if ((local_80 != (PerThreadSynch *)0x0) && (local_80->may_skip == false)) {
        local_80->may_skip = true;
        if (local_80->skip != (PerThreadSynch *)0x0) {
          raw_logging_internal::RawLog
                    (kFatal,"mutex.cc",0x878,"Check %s failed: %s","old_h->skip == nullptr",
                     "illegal skip from head");
        }
        if (local_80 != pPVar18) {
          pPVar13 = local_80->next;
          bVar20 = MuEquivalentWaiter(local_80,pPVar13);
          if (bVar20) {
            local_80->skip = pPVar13;
          }
        }
      }
    }
    pPVar13 = pPVar18->next;
    if ((pPVar13->waitp->how == (MuHow)kExclusiveS) &&
       ((pCVar3 = pPVar13->waitp->cond, pCVar3 == (Condition *)0x0 ||
        (pCVar3->eval_ == (_func_bool_Condition_ptr *)0x0)))) {
      pPVar13->wake = true;
      local_60 = (PerThreadSynch *)0x20;
      pPVar16 = pPVar13;
      pPVar11 = pPVar18;
LAB_001085d8:
      pPVar13 = pPVar16;
      local_50 = pPVar16;
      if (pPVar11->next != pPVar16) {
        raw_logging_internal::RawLog
                  (kFatal,"mutex.cc",0x8f5,"Check %s failed: %s","pw->next == w",
                   "pw not w\'s predecessor");
        pPVar13 = extraout_RDX_07;
      }
      bVar17 = 0;
      pPVar16 = (PerThreadSynch *)&wake_list;
      pPVar12 = pPVar18;
      local_58 = pPVar11;
      do {
        pPVar4 = pPVar11->next;
        if (pPVar4->wake == true) {
          local_38 = pPVar16;
          if (pPVar11->skip != (PerThreadSynch *)0x0) {
            local_40 = pPVar12;
            raw_logging_internal::RawLog
                      (kFatal,"mutex.cc",0x40c,"Check %s failed: %s","pw->skip == nullptr",
                       "bad skip in DequeueAllWakeable");
            pPVar12 = local_40;
          }
          pPVar12 = Dequeue(pPVar12,pPVar11);
          pPVar4->next = local_38->next;
          local_38->next = pPVar4;
          pPVar13 = extraout_RDX_04;
          pPVar16 = pPVar4;
          if (pPVar4->waitp->how == (MuHow)kExclusiveS) goto LAB_001086d7;
        }
        else {
          pPVar5 = pPVar4->skip;
          bVar17 = 1;
          pPVar11 = pPVar4;
          if (pPVar5 != (PerThreadSynch *)0x0) {
            pPVar6 = pPVar4;
            for (pPVar7 = pPVar5->skip; pPVar11 = pPVar5, pPVar7 != (PerThreadSynch *)0x0;
                pPVar7 = pPVar7->skip) {
              pPVar6->skip = pPVar7;
              pPVar6 = pPVar11;
              pPVar5 = pPVar7;
              pPVar13 = pPVar11;
            }
            pPVar4->skip = pPVar11;
          }
        }
        if ((pPVar12 != pPVar18) || ((bool)(pPVar11 == pPVar12 & bVar17))) goto LAB_001086d7;
      } while( true );
    }
    if ((pPVar16 != (PerThreadSynch *)0x0) &&
       ((pPVar16->waitp->how == (MuHow)kExclusiveS || (local_80 == pPVar18)))) {
      pPVar11 = local_58;
      if (local_58 == (PerThreadSynch *)0x0) {
        pPVar11 = pPVar18;
      }
      goto LAB_001085d8;
    }
    if (local_80 == pPVar18) {
      pPVar18->readers = 0;
      pPVar18->maybe_unlocking = false;
      if (waitp == (SynchWaitParams *)0x0) {
        uVar15 = uVar15 & 0xffffffffffffffd6;
      }
      else {
        pPVar13 = Enqueue(pPVar18,waitp,uVar15,2);
        uVar15 = (ulong)((uint)uVar15 & 0xd6) | (ulong)pPVar13;
        pPVar13 = extraout_RDX_06;
      }
      goto LAB_0010876a;
    }
    pPVar11 = local_80;
    if (local_80 == (PerThreadSynch *)0x0) {
      pPVar11 = pPVar18;
    }
    pPVar11 = pPVar11->next;
    pPVar18->may_skip = false;
    if (pPVar18->skip != (PerThreadSynch *)0x0) {
      raw_logging_internal::RawLog
                (kFatal,"mutex.cc",0x8b8,"Check %s failed: %s","h->skip == nullptr",
                 "illegal skip from head");
      pPVar13 = extraout_RDX_09;
    }
    pPVar18->maybe_unlocking = true;
    (this->mu_).super___atomic_base<long>._M_i = uVar15;
    pPVar12 = pPVar16;
    if (local_80 == pPVar18) {
      bVar20 = false;
    }
    else {
      while( true ) {
        pPVar16 = pPVar11;
        pPVar16->wake = false;
        pSVar2 = (SynchWaitParams *)pPVar16->waitp->cond;
        if ((pSVar2 == (SynchWaitParams *)0x0) ||
           ((pSVar2 != local_48 &&
            ((pSVar2->how == (MuHow)0x0 ||
             (cVar8 = (*(code *)pSVar2->how)(), pPVar13 = extraout_RDX_03, cVar8 != '\0')))))) {
          if (pPVar12 == (PerThreadSynch *)0x0) {
            pPVar16->wake = true;
            pPVar12 = pPVar16;
            local_58 = local_80;
            if (pPVar16->waitp->how == (MuHow)kExclusiveS) {
              bVar20 = false;
              local_60 = (PerThreadSynch *)0x20;
              goto LAB_0010876f;
            }
          }
          else if (pPVar16->waitp->how == (MuHow)kSharedS) {
            pPVar16->wake = true;
          }
          else {
            local_60 = (PerThreadSynch *)0x20;
          }
        }
        else {
          local_48 = (SynchWaitParams *)pPVar16->waitp->cond;
        }
        local_80 = pPVar16;
        if ((pPVar16->wake == false) && (pPVar11 = pPVar16->skip, pPVar11 != (PerThreadSynch *)0x0))
        {
          pPVar5 = pPVar16;
          for (pPVar4 = pPVar11->skip; local_80 = pPVar11, pPVar4 != (PerThreadSynch *)0x0;
              pPVar4 = pPVar4->skip) {
            pPVar5->skip = pPVar4;
            pPVar11 = pPVar4;
            pPVar13 = local_80;
            pPVar5 = local_80;
          }
          pPVar16->skip = local_80;
        }
        if (local_80 == pPVar18) break;
        pPVar11 = local_80->next;
      }
      bVar20 = false;
      pPVar16 = pPVar12;
    }
    goto LAB_0010876f;
  }
  if (waitp == (SynchWaitParams *)0x0) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x839,"Check %s failed: %s","waitp != nullptr",
               "UnlockSlow is confused");
  }
  bVar20 = true;
  do {
    uVar1 = (this->mu_).super___atomic_base<long>._M_i;
    uVar15 = uVar1 - 0x100;
    if ((long)uVar1 < 0x100) {
      uVar15 = uVar1;
    }
    if (bVar20) {
      bVar20 = waitp->cv_word == (atomic<long> *)0x0;
      pPVar13 = Enqueue((PerThreadSynch *)0x0,waitp,uVar15,2);
    }
    else {
      pPVar13 = (PerThreadSynch *)0x0;
    }
    uVar10 = 0xffffffd7;
    if ((uVar1 & 8) == 0) {
      bVar9 = ExactlyOneReader(uVar1);
      uVar10 = 0xffffffd7;
      if (bVar9) {
        uVar10 = 0xffffffde;
      }
    }
    uVar15 = uVar15 & 0xffffffffffffff00;
    if (pPVar13 != (PerThreadSynch *)0x0) {
      uVar15 = (ulong)pPVar13 | 4;
    }
    LOCK();
    bVar9 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar9) {
      (this->mu_).super___atomic_base<long>._M_i = uVar15 | uVar10 & (uint)uVar1 & 0x9f;
    }
    UNLOCK();
  } while (!bVar9);
LAB_0010896c:
  if (wake_list != (PerThreadSynch *)0x1) {
    if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
      lVar14 = rdtsc();
    }
    else {
      lVar14 = (*base_internal::CycleClock::cycle_clock_source_)();
    }
    lVar19 = 0;
    do {
      if (wake_list->cond_waiter == false) {
        lVar19 = (lVar19 + (lVar14 >> 2)) - wake_list->waitp->contention_start_cycles;
        wake_list->waitp->contention_start_cycles = lVar14 >> 2;
      }
      pPVar13 = wake_list->next;
      wake_list->next = (PerThreadSynch *)0x0;
      (wake_list->state)._M_i = kAvailable;
      AbslInternalPerThreadSemPost((ThreadIdentity *)wake_list);
      wake_list = pPVar13;
    } while (pPVar13 != (PerThreadSynch *)0x1);
    if (0 < lVar19) {
      (*(code *)(anonymous_namespace)::mutex_tracer)("slow release",this,lVar19);
      (*(code *)(anonymous_namespace)::submit_profile_data)(lVar19);
      return;
    }
  }
  return;
LAB_001086d7:
  if (waitp != (SynchWaitParams *)0x0) {
    pPVar12 = Enqueue(pPVar12,waitp,uVar15,2);
    pPVar13 = extraout_RDX_05;
  }
  pPVar16 = local_50;
  if (wake_list == (PerThreadSynch *)0x1) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x90c,"Check %s failed: %s","wake_list != kPerThreadSynchNull",
               "unexpected empty wake list");
    pPVar13 = extraout_RDX_08;
  }
  uVar15 = (ulong)((uint)uVar15 & 0x10);
  if (pPVar12 == (PerThreadSynch *)0x0) {
    uVar15 = uVar15 | 2;
  }
  else {
    pPVar12->readers = 0;
    pPVar12->maybe_unlocking = false;
    uVar15 = (ulong)pPVar12 | (ulong)local_60 | uVar15 | 6;
  }
LAB_0010876a:
  (this->mu_).super___atomic_base<long>._M_i = uVar15;
  bVar20 = true;
  pPVar18 = local_80;
LAB_0010876f:
  local_80 = pPVar18;
  if (bVar20) goto LAB_0010896c;
  goto LAB_001082ee;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void Mutex::UnlockSlow(SynchWaitParams *waitp) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  this->AssertReaderHeld();
  CheckForMutexCorruption(v, "Unlock");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this,
                (v & kMuWriter) != 0? SYNCH_EV_UNLOCK: SYNCH_EV_READERUNLOCK);
  }
  int c = 0;
  // the waiter under consideration to wake, or zero
  PerThreadSynch *w = nullptr;
  // the predecessor to w or zero
  PerThreadSynch *pw = nullptr;
  // head of the list searched previously, or zero
  PerThreadSynch *old_h = nullptr;
  // a condition that's known to be false.
  const Condition *known_false = nullptr;
  PerThreadSynch *wake_list = kPerThreadSynchNull;   // list of threads to wake
  intptr_t wr_wait = 0;        // set to kMuWrWait if we wake a reader and a
                               // later writer could have acquired the lock
                               // (starvation avoidance)
  ABSL_RAW_CHECK(waitp == nullptr || waitp->thread->waitp == nullptr ||
                     waitp->thread->suppress_fatal_errors,
                 "detected illegal recursion into Mutex code");
  // This loop finds threads wake_list to wakeup if any, and removes them from
  // the list of waiters.  In addition, it places waitp.thread on the queue of
  // waiters if waitp is non-zero.
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    if ((v & kMuWriter) != 0 && (v & (kMuWait | kMuDesig)) != kMuWait &&
        waitp == nullptr) {
      // fast writer release (writer with no waiters or with designated waker)
      if (mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                      std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & (kMuReader | kMuWait)) == kMuReader && waitp == nullptr) {
      // fast reader release (reader with no waiters)
      intptr_t clear = ExactlyOneReader(v) ? kMuReader | kMuOne : kMuOne;
      if (mu_.compare_exchange_strong(v, v - clear,
                                      std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & kMuSpin) == 0 &&  // attempt to get spinlock
               mu_.compare_exchange_strong(v, v | kMuSpin,
                                           std::memory_order_acquire,
                                           std::memory_order_relaxed)) {
      if ((v & kMuWait) == 0) {       // no one to wake
        intptr_t nv;
        bool do_enqueue = true;  // always Enqueue() the first time
        ABSL_RAW_CHECK(waitp != nullptr,
                       "UnlockSlow is confused");  // about to sleep
        do {    // must loop to release spinlock as reader count may change
          v = mu_.load(std::memory_order_relaxed);
          // decrement reader count if there are readers
          intptr_t new_readers = (v >= kMuOne)?  v - kMuOne : v;
          PerThreadSynch *new_h = nullptr;
          if (do_enqueue) {
            // If we are enqueuing on a CondVar (waitp->cv_word != nullptr) then
            // we must not retry here.  The initial attempt will always have
            // succeeded, further attempts would enqueue us against *this due to
            // Fer() handling.
            do_enqueue = (waitp->cv_word == nullptr);
            new_h = Enqueue(nullptr, waitp, new_readers, kMuIsCond);
          }
          intptr_t clear = kMuWrWait | kMuWriter;  // by default clear write bit
          if ((v & kMuWriter) == 0 && ExactlyOneReader(v)) {  // last reader
            clear = kMuWrWait | kMuReader;                    // clear read bit
          }
          nv = (v & kMuLow & ~clear & ~kMuSpin);
          if (new_h != nullptr) {
            nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
          } else {  // new_h could be nullptr if we queued ourselves on a
                    // CondVar
            // In that case, we must place the reader count back in the mutex
            // word, as Enqueue() did not store it in the new waiter.
            nv |= new_readers & kMuHigh;
          }
          // release spinlock & our lock; retry if reader-count changed
          // (writer count cannot change since we hold lock)
        } while (!mu_.compare_exchange_weak(v, nv,
                                            std::memory_order_release,
                                            std::memory_order_relaxed));
        break;
      }

      // There are waiters.
      // Set h to the head of the circular waiter list.
      PerThreadSynch *h = GetPerThreadSynch(v);
      if ((v & kMuReader) != 0 && (h->readers & kMuHigh) > kMuOne) {
        // a reader but not the last
        h->readers -= kMuOne;  // release our lock
        intptr_t nv = v;       // normally just release spinlock
        if (waitp != nullptr) {  // but waitp!=nullptr => must queue ourselves
          PerThreadSynch *new_h = Enqueue(h, waitp, v, kMuIsCond);
          ABSL_RAW_CHECK(new_h != nullptr,
                         "waiters disappeared during Enqueue()!");
          nv &= kMuLow;
          nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
        }
        mu_.store(nv, std::memory_order_release);  // release spinlock
        // can release with a store because there were waiters
        break;
      }

      // Either we didn't search before, or we marked the queue
      // as "maybe_unlocking" and no one else should have changed it.
      ABSL_RAW_CHECK(old_h == nullptr || h->maybe_unlocking,
                     "Mutex queue changed beneath us");

      // The lock is becoming free, and there's a waiter
      if (old_h != nullptr &&
          !old_h->may_skip) {                  // we used old_h as a terminator
        old_h->may_skip = true;                // allow old_h to skip once more
        ABSL_RAW_CHECK(old_h->skip == nullptr, "illegal skip from head");
        if (h != old_h && MuEquivalentWaiter(old_h, old_h->next)) {
          old_h->skip = old_h->next;  // old_h not head & can skip to successor
        }
      }
      if (h->next->waitp->how == kExclusive &&
          Condition::GuaranteedEqual(h->next->waitp->cond, nullptr)) {
        // easy case: writer with no condition; no need to search
        pw = h;                       // wake w, the successor of h (=pw)
        w = h->next;
        w->wake = true;
        // We are waking up a writer.  This writer may be racing against
        // an already awake reader for the lock.  We want the
        // writer to usually win this race,
        // because if it doesn't, we can potentially keep taking a reader
        // perpetually and writers will starve.  Worse than
        // that, this can also starve other readers if kMuWrWait gets set
        // later.
        wr_wait = kMuWrWait;
      } else if (w != nullptr && (w->waitp->how == kExclusive || h == old_h)) {
        // we found a waiter w to wake on a previous iteration and either it's
        // a writer, or we've searched the entire list so we have all the
        // readers.
        if (pw == nullptr) {  // if w's predecessor is unknown, it must be h
          pw = h;
        }
      } else {
        // At this point we don't know all the waiters to wake, and the first
        // waiter has a condition or is a reader.  We avoid searching over
        // waiters we've searched on previous iterations by starting at
        // old_h if it's set.  If old_h==h, there's no one to wakeup at all.
        if (old_h == h) {      // we've searched before, and nothing's new
                               // so there's no one to wake.
          intptr_t nv = (v & ~(kMuReader|kMuWriter|kMuWrWait));
          h->readers = 0;
          h->maybe_unlocking = false;   // finished unlocking
          if (waitp != nullptr) {       // we must queue ourselves and sleep
            PerThreadSynch *new_h = Enqueue(h, waitp, v, kMuIsCond);
            nv &= kMuLow;
            if (new_h != nullptr) {
              nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
            }  // else new_h could be nullptr if we queued ourselves on a
               // CondVar
          }
          // release spinlock & lock
          // can release with a store because there were waiters
          mu_.store(nv, std::memory_order_release);
          break;
        }

        // set up to walk the list
        PerThreadSynch *w_walk;   // current waiter during list walk
        PerThreadSynch *pw_walk;  // previous waiter during list walk
        if (old_h != nullptr) {  // we've searched up to old_h before
          pw_walk = old_h;
          w_walk = old_h->next;
        } else {            // no prior search, start at beginning
          pw_walk =
              nullptr;  // h->next's predecessor may change; don't record it
          w_walk = h->next;
        }

        h->may_skip = false;  // ensure we never skip past h in future searches
                              // even if other waiters are queued after it.
        ABSL_RAW_CHECK(h->skip == nullptr, "illegal skip from head");

        h->maybe_unlocking = true;  // we're about to scan the waiter list
                                    // without the spinlock held.
                                    // Enqueue must be conservative about
                                    // priority queuing.

        // We must release the spinlock to evaluate the conditions.
        mu_.store(v, std::memory_order_release);  // release just spinlock
        // can release with a store because there were waiters

        // h is the last waiter queued, and w_walk the first unsearched waiter.
        // Without the spinlock, the locations mu_ and h->next may now change
        // underneath us, but since we hold the lock itself, the only legal
        // change is to add waiters between h and w_walk.  Therefore, it's safe
        // to walk the path from w_walk to h inclusive. (TryRemove() can remove
        // a waiter anywhere, but it acquires both the spinlock and the Mutex)

        old_h = h;        // remember we searched to here

        // Walk the path upto and including h looking for waiters we can wake.
        while (pw_walk != h) {
          w_walk->wake = false;
          if (w_walk->waitp->cond ==
                  nullptr ||  // no condition => vacuously true OR
              (w_walk->waitp->cond != known_false &&
               // this thread's condition is not known false, AND
               //  is in fact true
               EvalConditionIgnored(this, w_walk->waitp->cond))) {
            if (w == nullptr) {
              w_walk->wake = true;    // can wake this waiter
              w = w_walk;
              pw = pw_walk;
              if (w_walk->waitp->how == kExclusive) {
                wr_wait = kMuWrWait;
                break;                // bail if waking this writer
              }
            } else if (w_walk->waitp->how == kShared) {  // wake if a reader
              w_walk->wake = true;
            } else {   // writer with true condition
              wr_wait = kMuWrWait;
            }
          } else {                  // can't wake; condition false
            known_false = w_walk->waitp->cond;  // remember last false condition
          }
          if (w_walk->wake) {   // we're waking reader w_walk
            pw_walk = w_walk;   // don't skip similar waiters
          } else {              // not waking; skip as much as possible
            pw_walk = Skip(w_walk);
          }
          // If pw_walk == h, then load of pw_walk->next can race with
          // concurrent write in Enqueue(). However, at the same time
          // we do not need to do the load, because we will bail out
          // from the loop anyway.
          if (pw_walk != h) {
            w_walk = pw_walk->next;
          }
        }

        continue;  // restart for(;;)-loop to wakeup w or to find more waiters
      }
      ABSL_RAW_CHECK(pw->next == w, "pw not w's predecessor");
      // The first (and perhaps only) waiter we've chosen to wake is w, whose
      // predecessor is pw.  If w is a reader, we must wake all the other
      // waiters with wake==true as well.  We may also need to queue
      // ourselves if waitp != null.  The spinlock and the lock are still
      // held.

      // This traverses the list in [ pw->next, h ], where h is the head,
      // removing all elements with wake==true and placing them in the
      // singly-linked list wake_list.  Returns the new head.
      h = DequeueAllWakeable(h, pw, &wake_list);

      intptr_t nv = (v & kMuEvent) | kMuDesig;
                                             // assume no waiters left,
                                             // set kMuDesig for INV1a

      if (waitp != nullptr) {  // we must queue ourselves and sleep
        h = Enqueue(h, waitp, v, kMuIsCond);
        // h is new last waiter; could be null if we queued ourselves on a
        // CondVar
      }

      ABSL_RAW_CHECK(wake_list != kPerThreadSynchNull,
                     "unexpected empty wake list");

      if (h != nullptr) {  // there are waiters left
        h->readers = 0;
        h->maybe_unlocking = false;     // finished unlocking
        nv |= wr_wait | kMuWait | reinterpret_cast<intptr_t>(h);
      }

      // release both spinlock & lock
      // can release with a store because there were waiters
      mu_.store(nv, std::memory_order_release);
      break;  // out of for(;;)-loop
    }
    // aggressive here; no one can proceed till we do
    c = synchronization_internal::MutexDelay(c, AGGRESSIVE);
  }                            // end of for(;;)-loop

  if (wake_list != kPerThreadSynchNull) {
    int64_t wait_cycles = 0;
    int64_t now = base_internal::CycleClock::Now();
    do {
      // Sample lock contention events only if the waiter was trying to acquire
      // the lock, not waiting on a condition variable or Condition.
      if (!wake_list->cond_waiter) {
        wait_cycles += (now - wake_list->waitp->contention_start_cycles);
        wake_list->waitp->contention_start_cycles = now;
      }
      wake_list = Wakeup(wake_list);              // wake waiters
    } while (wake_list != kPerThreadSynchNull);
    if (wait_cycles > 0) {
      mutex_tracer("slow release", this, wait_cycles);
      ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
      submit_profile_data(wait_cycles);
      ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    }
  }
}